

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

VP8StatusCode WebPIUpdate(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  MemBufferMode MVar1;
  VP8StatusCode VVar2;
  uint8_t *puVar3;
  
  if (data != (uint8_t *)0x0 && idec != (WebPIDecoder *)0x0) {
    VVar2 = VP8_STATUS_BITSTREAM_ERROR;
    if (idec->state_ != STATE_ERROR) {
      VVar2 = (uint)(idec->state_ != STATE_DONE) * 5;
    }
    if (VVar2 != VP8_STATUS_SUSPENDED) {
      return VVar2;
    }
    MVar1 = (idec->mem_).mode_;
    if (MVar1 != MEM_MODE_MAP) {
      if (MVar1 != MEM_MODE_NONE) {
        return VP8_STATUS_INVALID_PARAM;
      }
      (idec->mem_).mode_ = MEM_MODE_MAP;
    }
    puVar3 = (idec->mem_).buf_;
    if (puVar3 == (uint8_t *)0x0) {
      puVar3 = (uint8_t *)0x0;
    }
    else {
      puVar3 = puVar3 + (idec->mem_).start_;
    }
    if ((idec->mem_).buf_size_ <= data_size) {
      (idec->mem_).buf_ = data;
      (idec->mem_).buf_size_ = data_size;
      (idec->mem_).end_ = data_size;
      DoRemap(idec,(ptrdiff_t)(data + ((idec->mem_).start_ - (long)puVar3)));
      VVar2 = IDecode(idec);
      return VVar2;
    }
  }
  return VP8_STATUS_INVALID_PARAM;
}

Assistant:

VP8StatusCode WebPIUpdate(WebPIDecoder* idec,
                          const uint8_t* data, size_t data_size) {
  VP8StatusCode status;
  if (idec == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  status = IDecCheckStatus(idec);
  if (status != VP8_STATUS_SUSPENDED) {
    return status;
  }
  // Check mixed calls between RemapMemBuffer and AppendToMemBuffer.
  if (!CheckMemBufferMode(&idec->mem_, MEM_MODE_MAP)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  // Make the memory buffer point to the new buffer
  if (!RemapMemBuffer(idec, data, data_size)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  return IDecode(idec);
}